

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::CollationRootElements::getTertiaryBefore
          (CollationRootElements *this,uint32_t p,uint32_t s,uint32_t t)

{
  int32_t iVar1;
  uint local_28;
  uint32_t st;
  uint32_t secTer;
  uint32_t previousTer;
  int32_t index;
  uint32_t t_local;
  uint32_t s_local;
  uint32_t p_local;
  CollationRootElements *this_local;
  
  if (p == 0) {
    if (s == 0) {
      secTer = *this->elements;
      st = 0;
    }
    else {
      secTer = this->elements[1];
      st = 0x100;
    }
    local_28 = this->elements[(int)secTer] & 0xffffff7f;
  }
  else {
    iVar1 = findPrimary(this,p);
    secTer = iVar1 + 1;
    st = 0x100;
    local_28 = getFirstSecTerForPrimary(this,secTer);
  }
  while (local_28 < (s << 0x10 | t)) {
    if (local_28 >> 0x10 == s) {
      st = local_28;
    }
    local_28 = this->elements[(int)secTer] & 0xffffff7f;
    secTer = secTer + 1;
  }
  return st & 0xffff;
}

Assistant:

uint32_t
CollationRootElements::getTertiaryBefore(uint32_t p, uint32_t s, uint32_t t) const {
    U_ASSERT((t & ~Collation::ONLY_TERTIARY_MASK) == 0);
    int32_t index;
    uint32_t previousTer, secTer;
    if(p == 0) {
        if(s == 0) {
            index = (int32_t)elements[IX_FIRST_TERTIARY_INDEX];
            // Gap at the beginning of the tertiary CE range.
            previousTer = 0;
        } else {
            index = (int32_t)elements[IX_FIRST_SECONDARY_INDEX];
            previousTer = Collation::BEFORE_WEIGHT16;
        }
        secTer = elements[index] & ~SEC_TER_DELTA_FLAG;
    } else {
        index = findPrimary(p) + 1;
        previousTer = Collation::BEFORE_WEIGHT16;
        secTer = getFirstSecTerForPrimary(index);
    }
    uint32_t st = (s << 16) | t;
    while(st > secTer) {
        if((secTer >> 16) == s) { previousTer = secTer; }
        U_ASSERT((elements[index] & SEC_TER_DELTA_FLAG) != 0);
        secTer = elements[index++] & ~SEC_TER_DELTA_FLAG;
    }
    U_ASSERT(secTer == st);
    return previousTer & 0xffff;
}